

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionVariable.cpp
# Opt level: O1

Error * __thiscall
stick::ConditionVariable::notifyOne(Error *__return_storage_ptr__,ConditionVariable *this)

{
  SystemErrorCode _code;
  int iVar1;
  undefined4 extraout_var;
  String local_48;
  
  if ((this->m_bIsInitialized == false) ||
     (_code = pthread_cond_signal((pthread_cond_t *)this), _code == 0)) {
    stick::Error::Error(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (defaultAllocator()::m_def == '\0') {
    notifyOne();
  }
  local_48.m_cStr = (char *)0x0;
  local_48.m_length = 0;
  local_48.m_capacity = 0;
  local_48.m_allocator = &defaultAllocator::m_def->super_Allocator;
  iVar1 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                    (defaultAllocator::m_def,0x1c,1);
  local_48.m_cStr = (char *)CONCAT44(extraout_var,iVar1);
  local_48.m_cStr[0xc] = '\0';
  local_48.m_cStr[0xd] = '\0';
  local_48.m_cStr[0xe] = '\0';
  local_48.m_cStr[0xf] = '\0';
  local_48.m_cStr[0x10] = '\0';
  local_48.m_cStr[0x11] = '\0';
  local_48.m_cStr[0x12] = '\0';
  local_48.m_cStr[0x13] = '\0';
  local_48.m_cStr[0x14] = '\0';
  local_48.m_cStr[0x15] = '\0';
  local_48.m_cStr[0x16] = '\0';
  local_48.m_cStr[0x17] = '\0';
  local_48.m_cStr[0x18] = '\0';
  local_48.m_cStr[0x19] = '\0';
  local_48.m_cStr[0x1a] = '\0';
  local_48.m_cStr[0x1b] = '\0';
  local_48.m_cStr[0] = '\0';
  local_48.m_cStr[1] = '\0';
  local_48.m_cStr[2] = '\0';
  local_48.m_cStr[3] = '\0';
  local_48.m_cStr[4] = '\0';
  local_48.m_cStr[5] = '\0';
  local_48.m_cStr[6] = '\0';
  local_48.m_cStr[7] = '\0';
  local_48.m_cStr[8] = '\0';
  local_48.m_cStr[9] = '\0';
  local_48.m_cStr[10] = '\0';
  local_48.m_cStr[0xb] = '\0';
  local_48.m_cStr[0xc] = '\0';
  local_48.m_cStr[0xd] = '\0';
  local_48.m_cStr[0xe] = '\0';
  local_48.m_cStr[0xf] = '\0';
  if (local_48.m_cStr != (char *)0x0) {
    local_48.m_capacity = 0x1b;
    local_48.m_length = 0x1b;
    builtin_strncpy(local_48.m_cStr,"pthread_cond_signal failed.",0x1c);
    stick::Error::Error<stick::ec::SystemErrorCode>
              (__return_storage_ptr__,_code,&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/ConditionVariable.cpp"
               ,0x1a,(type *)0x0);
    if (local_48.m_cStr == (char *)0x0) {
      return __return_storage_ptr__;
    }
    (*((Allocator *)&(local_48.m_allocator)->_vptr_Allocator)->_vptr_Allocator[3])();
    return __return_storage_ptr__;
  }
  __assert_fail("m_cStr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                ,0x1a0,"void stick::String::reserve(Size)");
}

Assistant:

Error ConditionVariable::notifyOne()
{
    if (!m_bIsInitialized)
        return Error();
#ifdef STICK_PLATFORM_UNIX
    int res = pthread_cond_signal(&m_handle);
    if (res != 0)
        return Error(
            ec::SystemErrorCode(res), "pthread_cond_signal failed.", STICK_FILE, STICK_LINE);
    return Error();
#endif // STICK_PLATFORM_UNIX
}